

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phashtable.c
# Opt level: O3

void p_hash_table_insert(PHashTable *table,ppointer key,ppointer value)

{
  PHashTableNode **ppPVar1;
  PHashTableNode *pPVar2;
  ulong uVar3;
  
  if (table != (PHashTable *)0x0) {
    uVar3 = (ulong)(long)((int)key + 0x25) % table->size & 0xffffffff;
    pPVar2 = (PHashTableNode *)(table->table + uVar3);
    do {
      pPVar2 = pPVar2->next;
      if (pPVar2 == (PHashTableNode *)0x0) {
        pPVar2 = (PHashTableNode *)p_malloc0(0x18);
        if (pPVar2 != (PHashTableNode *)0x0) {
          pPVar2->key = key;
          pPVar2->value = value;
          ppPVar1 = table->table;
          pPVar2->next = ppPVar1[uVar3];
          ppPVar1[uVar3] = pPVar2;
          return;
        }
        printf("** Error: %s **\n","PHashTable::p_hash_table_insert: failed to allocate memory");
        return;
      }
    } while (pPVar2->key != key);
    pPVar2->value = value;
  }
  return;
}

Assistant:

P_LIB_API void
p_hash_table_insert (PHashTable *table, ppointer key, ppointer value)
{
	PHashTableNode	*node;
	puint		hash;

	if (P_UNLIKELY (table == NULL))
		return;

	hash = pp_hash_table_calc_hash (key, table->size);

	if ((node = pp_hash_table_find_node (table, key, hash)) == NULL) {
		if (P_UNLIKELY ((node = p_malloc0 (sizeof (PHashTableNode))) == NULL)) {
			P_ERROR ("PHashTable::p_hash_table_insert: failed to allocate memory");
			return;
		}

		/* Insert a new node in front of others */
		node->key   = key;
		node->value = value;
		node->next  = table->table[hash];

		table->table[hash] = node;
	} else
		node->value = value;
}